

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitvector.hpp
# Opt level: O2

subtree_ref_base<true> * __thiscall
bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::subtree_ref_base<true>::child
          (subtree_ref_base<true> *__return_storage_ptr__,subtree_ref_base<true> *this,size_t k)

{
  size_t sVar1;
  bt_impl_t *pbVar2;
  value_type vVar3;
  value_type vVar4;
  value_type vVar5;
  long lVar6;
  const_item_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
  *pcVar7;
  value_type vVar8;
  const_item_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
  local_70;
  const_item_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
  local_60;
  const_item_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
  local_50;
  const_item_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
  local_40;
  
  local_70._v = &this->_vector->pointers;
  local_70._index = (this->_vector->degree + 1) * this->_index + k;
  vVar3 = const_item_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
          ::value(&local_70);
  sVar1 = this->_height;
  pbVar2 = this->_vector;
  if (k == 0) {
    local_70._v = &pbVar2->sizes;
    local_70._index = pbVar2->degree * this->_index;
    vVar8 = const_item_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
            ::value(&local_70);
    local_70._v = &this->_vector->ranks;
    local_70._index = this->_vector->degree * this->_index;
    vVar4 = const_item_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
            ::value(&local_70);
  }
  else {
    if (pbVar2->degree == k) {
      vVar8 = this->_size;
      pcVar7 = &local_40;
      lVar6 = this->_index * k;
    }
    else {
      local_50._v = &pbVar2->sizes;
      local_50._index = pbVar2->degree * this->_index + k;
      vVar8 = const_item_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
              ::value(&local_50);
      pbVar2 = this->_vector;
      pcVar7 = &local_60;
      lVar6 = pbVar2->degree * this->_index;
    }
    pcVar7->_v = &pbVar2->sizes;
    pcVar7->_index = (k - 1) + lVar6;
    vVar4 = const_item_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
            ::value(pcVar7);
    vVar8 = vVar8 - vVar4;
    pbVar2 = this->_vector;
    if (pbVar2->degree == k) {
      vVar4 = this->_rank;
      local_40._v = &pbVar2->ranks;
      pcVar7 = &local_40;
      local_40._index = (k - 1) + this->_index * k;
    }
    else {
      local_50._v = &pbVar2->ranks;
      local_50._index = pbVar2->degree * this->_index + k;
      vVar4 = const_item_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
              ::value(&local_50);
      pcVar7 = &local_60;
      local_60._v = &this->_vector->ranks;
      local_60._index = (k - 1) + this->_vector->degree * this->_index;
    }
    vVar5 = const_item_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
            ::value(pcVar7);
    vVar4 = vVar4 - vVar5;
  }
  __return_storage_ptr__->_vector = this->_vector;
  __return_storage_ptr__->_index = vVar3;
  __return_storage_ptr__->_height = sVar1 - 1;
  __return_storage_ptr__->_size = vVar8;
  __return_storage_ptr__->_rank = vVar4;
  return __return_storage_ptr__;
}

Assistant:

subtree_ref_base child(size_t k) const
            {
                assert(is_node());
                assert(k <= degree());
                assert(pointers(k) != 0);
                
                size_t p = pointers(k);
                size_t h = height() - 1;
                
                // Size of the subtree
                size_t s = k == 0        ? sizes(k) :
                           k == degree() ? size()   - sizes(k - 1) :
                                           sizes(k) - sizes(k - 1);
                
                // Rank of the subtree
                size_t r = k == 0        ? ranks(k) :
                           k == degree() ? rank()   - ranks(k - 1) :
                                           ranks(k) - ranks(k - 1);
                
                return { _vector, p, h, s, r };
            }